

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sup.c
# Opt level: O1

void supfind(errcxdef *ec,tokthdef *htab,voccxdef *voc,objnum *preinit,int warnlevel,int cf)

{
  int err;
  
  err = 0;
  supfind1(ec,&htab->tokthsc,"Me",&voc->voccxme,1,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"takeVerb",&voc->voccxvtk,1,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"strObj",&voc->voccxstr,1,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"numObj",&voc->voccxnum,1,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"pardon",&voc->voccxprd,1,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"againVerb",&voc->voccxvag,1,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"init",&voc->voccxini,1,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"preinit",preinit,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"preparse",&voc->voccxpre,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"preparseExt",&voc->voccxpre2,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"parseError",&voc->voccxper,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"commandPrompt",&voc->voccxprom,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"parseDisambig",&voc->voccxpdis,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"parseError2",&voc->voccxper2,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"parseDefault",&voc->voccxpdef,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"parseDefaultExt",&voc->voccxpdef2,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"parseAskobj",&voc->voccxpask,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"preparseCmd",&voc->voccxppc,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"parseAskobjActor",&voc->voccxpask2,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"parseAskobjIndirect",&voc->voccxpask3,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"parseErrorParam",&voc->voccxperp,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"commandAfterRead",&voc->voccxpostprom,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"initRestore",&voc->voccxinitrestore,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"parseUnknownVerb",&voc->voccxpuv,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"parseNounPhrase",&voc->voccxpnp,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"postAction",&voc->voccxpostact,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"endCommand",&voc->voccxendcmd,0,&err,warnlevel,cf);
  supfind1(ec,&htab->tokthsc,"preCommand",&voc->voccxprecmd,0,&err,warnlevel,cf);
  voc->voccxme_init = voc->voccxme;
  if (err == 0) {
    return;
  }
  errsigf(ec,"TADS",0x25d);
}

Assistant:

void supfind(errcxdef *ec, tokthdef *htab, voccxdef *voc,
             objnum *preinit, int warnlevel, int cf)
{
    int      err = 0;
    toktdef *tab = &htab->tokthsc;

    /* look up the required and optional symbols */
    supfind1(ec, tab, "Me", &voc->voccxme, TRUE, &err, warnlevel, cf);
    supfind1(ec, tab, "takeVerb", &voc->voccxvtk, TRUE, &err, warnlevel, cf);
    supfind1(ec, tab, "strObj", &voc->voccxstr, TRUE, &err, warnlevel, cf);
    supfind1(ec, tab, "numObj", &voc->voccxnum, TRUE, &err, warnlevel, cf);
    supfind1(ec, tab, "pardon", &voc->voccxprd, TRUE, &err, warnlevel, cf);
    supfind1(ec, tab, "againVerb", &voc->voccxvag, TRUE, &err, warnlevel, cf);
    supfind1(ec, tab, "init", &voc->voccxini, TRUE, &err, warnlevel, cf);
    supfind1(ec, tab, "preinit", preinit, FALSE, &err, warnlevel, cf);
    supfind1(ec, tab, "preparse", &voc->voccxpre, FALSE, &err, warnlevel, cf);
    supfind1(ec, tab, "preparseExt", &voc->voccxpre2, FALSE, &err,
             warnlevel, cf);
    supfind1(ec, tab, "parseError", &voc->voccxper, FALSE, &err, warnlevel,
             cf);
    supfind1(ec, tab, "commandPrompt", &voc->voccxprom, FALSE, &err,
             warnlevel, cf);
    supfind1(ec, tab, "parseDisambig", &voc->voccxpdis, FALSE, &err,
             warnlevel, cf);
    supfind1(ec, tab, "parseError2", &voc->voccxper2, FALSE, &err, warnlevel,
             cf);
    supfind1(ec, tab, "parseDefault", &voc->voccxpdef, FALSE, &err, warnlevel,
             cf);
    supfind1(ec, tab, "parseDefaultExt", &voc->voccxpdef2, FALSE, &err,
             warnlevel, cf);
    supfind1(ec, tab, "parseAskobj", &voc->voccxpask, FALSE, &err, warnlevel,
             cf);
    supfind1(ec, tab, "preparseCmd", &voc->voccxppc, FALSE, &err, warnlevel,
             cf);
    supfind1(ec, tab, "parseAskobjActor", &voc->voccxpask2, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "parseAskobjIndirect", &voc->voccxpask3, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "parseErrorParam", &voc->voccxperp, FALSE, &err,
             warnlevel, cf);
    supfind1(ec, tab, "commandAfterRead", &voc->voccxpostprom, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "initRestore", &voc->voccxinitrestore, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "parseUnknownVerb", &voc->voccxpuv, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "parseNounPhrase", &voc->voccxpnp, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "postAction", &voc->voccxpostact, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "endCommand", &voc->voccxendcmd, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "preCommand", &voc->voccxprecmd, FALSE,
             &err, warnlevel, cf);

    /* "Me" is always the initial Me object */
    voc->voccxme_init = voc->voccxme;

    /* if we encountered any errors, signal the problem */
    if (err)
        errsig(ec, ERR_UNDEF);
}